

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

void SL::WS_LITE::
     ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *psVar1;
  bool bVar2;
  byte bVar3;
  unsigned_short uVar4;
  element_type *peVar5;
  unsigned_long_long uVar6;
  size_t sVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  void *pvVar9;
  element_type *peVar10;
  ulong uVar11;
  unsigned_long uVar12;
  element_type *peVar13;
  uchar *puVar14;
  ostream *this;
  element_type *peVar15;
  allocator<char> local_6e1;
  string local_6e0;
  type local_6c0;
  mutable_buffer local_698;
  size_t local_688;
  size_t dataconsumed_1;
  size_t bytestoread_1;
  string local_670;
  ostringstream local_650 [8];
  ostringstream buffersl134nonesd_2;
  allocator<char> local_4d1;
  string local_4d0;
  ostringstream local_4b0 [8];
  ostringstream buffersl134nonesd_1;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  ostringstream local_2e8 [8];
  ostringstream buffersl134nonesd;
  size_t addedsize;
  shared_ptr<unsigned_char> ptr;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> local_150;
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_> local_140;
  shared_ptr<unsigned_char> local_130;
  mutable_buffer local_120;
  size_t local_110;
  size_t dataconsumed;
  size_t bytestoread;
  undefined1 local_f8 [8];
  shared_ptr<unsigned_char> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  string local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  size_t size;
  undefined1 local_70 [6];
  OpCode opcode;
  allocator<char> local_39;
  string local_38;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *local_18;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata_local;
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
  *socket_local;
  
  local_18 = extradata;
  extradata_local = (shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *)socket;
  peVar5 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  bVar2 = DidPassMaskRequirement(peVar5->ReceiveHeader,false);
  psVar1 = extradata_local;
  if (bVar2) {
    peVar5 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)extradata_local);
    bVar2 = getrsv2(peVar5->ReceiveHeader);
    if (!bVar2) {
      peVar5 = std::
               __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)extradata_local);
      bVar2 = getrsv3(peVar5->ReceiveHeader);
      if (!bVar2) {
        peVar5 = std::
                 __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)extradata_local);
        bVar2 = getrsv1(peVar5->ReceiveHeader);
        if ((!bVar2) ||
           (peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local), peVar5->ExtensionOption != NO_OPTIONS)) {
          peVar5 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)extradata_local);
          size._6_1_ = getOpCode(peVar5->ReceiveHeader);
          peVar5 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)extradata_local);
          bVar3 = getpayloadLength1(peVar5->ReceiveHeader);
          local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)bVar3;
          if (local_80 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7e) {
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            uVar4 = getpayloadLength2(peVar5->ReceiveHeader);
            uVar4 = ntoh<unsigned_short>(uVar4);
            local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar4;
          }
          else if (local_80 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7f) {
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            uVar6 = getpayloadLength8(peVar5->ReceiveHeader);
            uVar6 = ntoh<unsigned_long_long>(uVar6);
            local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
            uVar12 = std::numeric_limits<unsigned_long>::max();
            psVar1 = extradata_local;
            if (uVar12 < uVar6) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a0,"Payload exceeded MaxPayload size",&local_a1);
              sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                        ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                          *)psVar1,0x3f1,&local_a0);
              std::__cxx11::string::~string((string *)&local_a0);
              std::allocator<char>::~allocator(&local_a1);
              return;
            }
          }
          sVar7 = AdditionalBodyBytesToRead(false);
          psVar1 = extradata_local;
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar7 + (long)local_80);
          local_80 = p_Var8;
          if (((size._6_1_ == '\t') || (size._6_1_ == '\n')) || (size._6_1_ == '\b')) {
            sVar7 = AdditionalBodyBytesToRead(false);
            psVar1 = extradata_local;
            if (0x7d < (long)p_Var8 - sVar7) {
              __return_storage_ptr__ =
                   &buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ;
              std::__cxx11::to_string((string *)__return_storage_ptr__,(unsigned_long)local_80);
              std::operator+(&local_c8,"Payload exceeded for control frames. Size requested ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __return_storage_ptr__);
              sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                        ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                          *)psVar1,0x3ea,&local_c8);
              std::__cxx11::string::~string((string *)&local_c8);
              std::__cxx11::string::~string
                        ((string *)
                         &buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              return;
            }
            if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pvVar9 = operator_new__((ulong)local_80);
              std::shared_ptr<unsigned_char>::
              shared_ptr<unsigned_char,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(unsigned_char*)_1_,void>
                        ((shared_ptr<unsigned_char> *)local_f8,pvVar9);
              dataconsumed = (size_t)local_80;
              peVar10 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_f8);
              local_110 = ReadFromExtraData(peVar10,dataconsumed,local_18);
              dataconsumed = dataconsumed - local_110;
              peVar5 = std::
                       __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)extradata_local);
              peVar10 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_f8);
              local_120 = (mutable_buffer)asio::buffer(peVar10 + local_110,dataconsumed);
              ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_80;
              std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>::shared_ptr
                        (&local_150,local_18);
              std::
              shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
              ::shared_ptr(&local_140,
                           (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                            *)extradata_local);
              std::shared_ptr<unsigned_char>::shared_ptr
                        (&local_130,(shared_ptr<unsigned_char> *)local_f8);
              asio::
              async_read<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
                        (&peVar5->Socket,(mutable_buffers_1 *)&local_120,
                         (type *)&ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(type *)0x0);
              ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)
              ::{lambda(std::error_code_const&,unsigned_long)#1}::~error_code
                        ((_lambda_std__error_code_const__unsigned_long__1_ *)
                         &ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)local_f8);
              return;
            }
            std::shared_ptr<unsigned_char>::shared_ptr((shared_ptr<unsigned_char> *)&addedsize);
            ProcessControlMessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                        *)extradata_local,(shared_ptr<unsigned_char> *)&addedsize,0,local_18);
            std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&addedsize);
            return;
          }
          if (((size._6_1_ != '\x01') && (size._6_1_ != '\x02')) && (size._6_1_ != '\0')) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_6e0,"Closing connection. nonvalid op code",&local_6e1);
            sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                        *)psVar1,0x3ea,&local_6e0);
            std::__cxx11::string::~string((string *)&local_6e0);
            std::allocator<char>::~allocator(&local_6e1);
            return;
          }
          peVar5 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)extradata_local);
          uVar11 = (long)&local_80->_vptr__Sp_counted_base + peVar5->ReceiveBufferSize;
          uVar12 = std::numeric_limits<unsigned_long>::max();
          if (uVar12 < uVar11) {
            std::__cxx11::ostringstream::ostringstream(local_2e8);
            std::operator<<((ostream *)local_2e8,"payload exceeds memory on system!!! ");
            Log(ERROR_log_level,
                "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                ,0x1bd,"ReadBody",(ostringstream *)local_2e8);
            std::__cxx11::ostringstream::~ostringstream(local_2e8);
            psVar1 = extradata_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_308,"Payload exceeded MaxPayload size",&local_309);
            sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                        *)psVar1,0x3f1,&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::allocator<char>::~allocator(&local_309);
            return;
          }
          peVar5 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)extradata_local);
          peVar5->ReceiveBufferSize = uVar11;
          peVar5 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)extradata_local);
          uVar11 = peVar5->ReceiveBufferSize;
          peVar5 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)extradata_local);
          peVar13 = std::
                    __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&peVar5->Parent);
          psVar1 = extradata_local;
          if (peVar13->MaxPayload < uVar11) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_330,"Payload exceeded MaxPayload size",&local_331);
            sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                        *)psVar1,0x3f1,&local_330);
            std::__cxx11::string::~string((string *)&local_330);
            std::allocator<char>::~allocator(&local_331);
            return;
          }
          peVar5 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)extradata_local);
          uVar11 = peVar5->ReceiveBufferSize;
          uVar12 = std::numeric_limits<unsigned_long>::max();
          if (uVar12 < uVar11) {
            std::__cxx11::ostringstream::ostringstream(local_4b0);
            std::operator<<((ostream *)local_4b0,"payload exceeds memory on system!!! ");
            Log(ERROR_log_level,
                "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                ,0x1c6,"ReadBody",(ostringstream *)local_4b0);
            std::__cxx11::ostringstream::~ostringstream(local_4b0);
            psVar1 = extradata_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4d0,"Payload exceeded MaxPayload size",&local_4d1);
            sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                        *)psVar1,0x3f1,&local_4d0);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::allocator<char>::~allocator(&local_4d1);
            return;
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            puVar14 = peVar5->ReceiveBuffer;
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            puVar14 = (uchar *)realloc(puVar14,peVar5->ReceiveBufferSize);
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            peVar5->ReceiveBuffer = puVar14;
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            if (peVar5->ReceiveBuffer == (uchar *)0x0) {
              std::__cxx11::ostringstream::ostringstream(local_650);
              this = std::operator<<((ostream *)local_650,
                                     "MEMORY ALLOCATION ERROR!!! Tried to realloc ");
              peVar5 = std::
                       __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)extradata_local);
              std::ostream::operator<<(this,peVar5->ReceiveBufferSize);
              Log(ERROR_log_level,
                  "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                  ,0x1cd,"ReadBody",(ostringstream *)local_650);
              std::__cxx11::ostringstream::~ostringstream(local_650);
              psVar1 = extradata_local;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_670,"Payload exceeded MaxPayload size",
                         (allocator<char> *)((long)&bytestoread_1 + 7));
              sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                        ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                          *)psVar1,0x3f1,&local_670);
              std::__cxx11::string::~string((string *)&local_670);
              std::allocator<char>::~allocator((allocator<char> *)((long)&bytestoread_1 + 7));
              return;
            }
            dataconsumed_1 = (size_t)local_80;
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            puVar14 = peVar5->ReceiveBuffer;
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            local_688 = ReadFromExtraData(puVar14 + (peVar5->ReceiveBufferSize - (long)local_80),
                                          dataconsumed_1,local_18);
            dataconsumed_1 = dataconsumed_1 - local_688;
            peVar5 = std::
                     __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)extradata_local);
            peVar15 = std::
                      __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)extradata_local);
            puVar14 = peVar15->ReceiveBuffer;
            peVar15 = std::
                      __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)extradata_local);
            local_698 = (mutable_buffer)
                        asio::buffer(puVar14 + local_688 +
                                               (peVar15->ReceiveBufferSize - (long)local_80),
                                     dataconsumed_1);
            local_6c0.size = (size_t)local_80;
            std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>::shared_ptr
                      (&local_6c0.extradata,local_18);
            std::
            shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>::
            shared_ptr((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                        *)&local_6c0.socket,
                       (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                        *)extradata_local);
            asio::
            async_read<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(std::error_code_const&,unsigned_long)_2_>
                      (&peVar5->Socket,(mutable_buffers_1 *)&local_698,&local_6c0,(type *)0x0);
            ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)
            ::{lambda(std::error_code_const&,unsigned_long)#2}::~error_code
                      ((_lambda_std__error_code_const__unsigned_long__2_ *)&local_6c0);
            return;
          }
          ProcessMessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                    ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                      *)extradata_local,local_18);
          return;
        }
      }
    }
    psVar1 = extradata_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"Closing connection. rsv bit set",
               (allocator<char> *)((long)&size + 7));
    sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *)psVar1,0x3ea,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Closing connection because mask requirement not met",&local_39);
    sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              ((shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *)psVar1,0x3ea,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

inline void ReadBody(const SOCKETTYPE &socket, const std::shared_ptr<asio::streambuf> &extradata)
    {
        if (!DidPassMaskRequirement(socket->ReceiveHeader, isServer)) { // Close connection if it did not meet the mask requirement.
            return sendclosemessage<isServer>(socket, 1002, "Closing connection because mask requirement not met");
        }
        if (getrsv2(socket->ReceiveHeader) || getrsv3(socket->ReceiveHeader) ||
            (getrsv1(socket->ReceiveHeader) && socket->ExtensionOption == ExtensionOptions::NO_OPTIONS)) {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. rsv bit set");
        }
        auto opcode = static_cast<OpCode>(getOpCode(socket->ReceiveHeader));

        size_t size = getpayloadLength1(socket->ReceiveHeader);
        switch (size) {
        case 126:
            size = ntoh(getpayloadLength2(socket->ReceiveHeader));
            break;
        case 127:
            size = static_cast<size_t>(ntoh(getpayloadLength8(socket->ReceiveHeader)));
            if (size > std::numeric_limits<std::size_t>::max()) {
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            break;
        default:
            break;
        }

        size += AdditionalBodyBytesToRead(isServer);
        if (opcode == OpCode::PING || opcode == OpCode::PONG || opcode == OpCode::CLOSE) {
            if (size - AdditionalBodyBytesToRead(isServer) > CONTROLBUFFERMAXSIZE) {
                return sendclosemessage<isServer>(socket, 1002, "Payload exceeded for control frames. Size requested " + std::to_string(size));
            }
            else if (size > 0) {
                auto buffer = std::shared_ptr<unsigned char>(new unsigned char[size], [](unsigned char *p) { delete[] p; });

                auto bytestoread = size;
                auto dataconsumed = ReadFromExtraData(buffer.get(), bytestoread, extradata);
                bytestoread -= dataconsumed;

                asio::async_read(socket->Socket, asio::buffer(buffer.get() + dataconsumed, bytestoread),
                                 [size, extradata, socket, buffer](const std::error_code &ec, size_t) {
                                     if (!ec) {
                                         UnMaskMessage(size, buffer.get(), isServer);
                                         auto tempsize = size - AdditionalBodyBytesToRead(isServer);
                                         return ProcessControlMessage<isServer>(socket, buffer, tempsize, extradata);
                                     }
                                     else {
                                         return sendclosemessage<isServer>(socket, 1002, "ReadBody Error " + ec.message());
                                     }
                                 });
            }
            else {
                std::shared_ptr<unsigned char> ptr;
                return ProcessControlMessage<isServer>(socket, ptr, 0, extradata);
            }
        }

        else if (opcode == OpCode::TEXT || opcode == OpCode::BINARY || opcode == OpCode::CONTINUATION) {
            auto addedsize = socket->ReceiveBufferSize + size;
            if (addedsize > std::numeric_limits<std::size_t>::max()) {
                SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "payload exceeds memory on system!!! ");
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            socket->ReceiveBufferSize = addedsize;

            if (socket->ReceiveBufferSize > socket->Parent->MaxPayload) {
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            if (socket->ReceiveBufferSize > std::numeric_limits<std::size_t>::max()) {
                SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "payload exceeds memory on system!!! ");
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }

            if (size > 0) {
                socket->ReceiveBuffer = static_cast<unsigned char *>(realloc(socket->ReceiveBuffer, socket->ReceiveBufferSize));
                if (!socket->ReceiveBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "MEMORY ALLOCATION ERROR!!! Tried to realloc " << socket->ReceiveBufferSize);
                    return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
                }

                auto bytestoread = size;
                auto dataconsumed = ReadFromExtraData(socket->ReceiveBuffer + socket->ReceiveBufferSize - size, bytestoread, extradata);
                bytestoread -= dataconsumed;
                asio::async_read(socket->Socket, asio::buffer(socket->ReceiveBuffer + socket->ReceiveBufferSize - size + dataconsumed, bytestoread),
                                 [size, extradata, socket](const std::error_code &ec, size_t) {
                                     if (!ec) {
                                         auto buffer = socket->ReceiveBuffer + socket->ReceiveBufferSize - size;
                                         UnMaskMessage(size, buffer, isServer);
                                         socket->ReceiveBufferSize -= AdditionalBodyBytesToRead(isServer);
                                         return ProcessMessage<isServer>(socket, extradata);
                                     }
                                     else {
                                         return sendclosemessage<isServer>(socket, 1002, "ReadBody Error " + ec.message());
                                     }
                                 });
            }
            else {
                return ProcessMessage<isServer>(socket, extradata);
            }
        }
        else {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. nonvalid op code");
        }
    }